

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

int __thiscall llvm::StringRef::compare(StringRef *this,StringRef RHS)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  
  uVar4 = RHS.Length;
  uVar1 = this->Length;
  __n = uVar4;
  if (uVar1 < uVar4) {
    __n = uVar1;
  }
  if (__n == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = memcmp(this->Data,RHS.Data,__n);
  }
  if (iVar2 == 0) {
    if (uVar1 == uVar4) {
      return 0;
    }
    uVar3 = -(uint)(uVar1 < uVar4);
  }
  else {
    uVar3 = iVar2 >> 0x1f;
  }
  return uVar3 | 1;
}

Assistant:

LLVM_NODISCARD
    int compare(StringRef RHS) const {
      // Check the prefix for a mismatch.
      if (int Res = compareMemory(Data, RHS.Data, std::min(Length, RHS.Length)))
        return Res < 0 ? -1 : 1;

      // Otherwise the prefixes match, so we only need to check the lengths.
      if (Length == RHS.Length)
        return 0;
      return Length < RHS.Length ? -1 : 1;
    }